

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O1

void outputPtrBytes(void *val,char *outBuf,int32_t *outIx,int32_t capacity)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  undefined8 local_38;
  
  pcVar2 = (char *)((long)&local_38 + 7);
  iVar3 = 0;
  local_38 = val;
  do {
    cVar1 = *pcVar2;
    lVar4 = 4;
    do {
      outputChar("0123456789abcdef"[(uint)((long)cVar1 >> ((byte)lVar4 & 0x3f)) & 0xf],outBuf,outIx,
                 capacity,0);
      lVar4 = lVar4 + -4;
    } while (lVar4 != -4);
    pcVar2 = pcVar2 + -1;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 8);
  return;
}

Assistant:

static void outputPtrBytes(void *val, char *outBuf, int32_t *outIx, int32_t capacity) {
    uint32_t  i;
    int32_t  incVal = 1;              /* +1 for big endian, -1 for little endian          */
    char     *p     = (char *)&val;   /* point to current byte to output in the ptr val  */

#if !U_IS_BIG_ENDIAN
    /* Little Endian.  Move p to most significant end of the value      */
    incVal = -1;
    p += sizeof(void *) - 1;
#endif

    /* Loop through the bytes of the ptr as it sits in memory, from 
     * most significant to least significant end                    */
    for (i=0; i<sizeof(void *); i++) {
        outputHexBytes(*p, 2, outBuf, outIx, capacity);
        p += incVal;
    }
}